

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.h
# Opt level: O0

void __thiscall
CMU462::DynamicScene::DirectionalLight::DirectionalLight
          (DirectionalLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  Vector4D *in_RDX;
  long in_RSI;
  Vector3D *in_RDI;
  Vector4D *in_stack_00000060;
  Matrix4x4 *in_stack_00000068;
  Vector4D local_88 [2];
  double local_30;
  double local_28;
  double local_20;
  Vector4D *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SceneLight::SceneLight((SceneLight *)in_RDI);
  in_RDI->x = (double)&PTR_get_static_light_003bb358;
  Spectrum::Spectrum((Spectrum *)&in_RDI->y,0.0,0.0,0.0);
  Vector3D::Vector3D(in_RDI + 1);
  in_RDI->y = *(double *)(local_10 + 0x4c);
  *(undefined4 *)&in_RDI->z = *(undefined4 *)(local_10 + 0x54);
  Vector4D::Vector4D(local_88,(Vector3D *)(local_10 + 0x70),1.0);
  Matrix4x4::operator*(in_stack_00000068,in_stack_00000060);
  Vector4D::to3D(local_18);
  Vector3D::operator-((Vector3D *)local_18);
  in_RDI[1].x = local_30;
  in_RDI[1].y = local_28;
  in_RDI[1].z = local_20;
  Vector3D::normalize(in_RDI);
  return;
}

Assistant:

DirectionalLight(const Collada::LightInfo& light_info,
                   const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->direction = -(transform * Vector4D(light_info.direction, 1)).to3D();
    this->direction.normalize();
  }